

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O0

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBoundsParamTestInstance>::
createInstance(InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBoundsParamTestInstance>
               *this,Context *context)

{
  Context *context_00;
  TestInstance *this_00;
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_48;
  Context *local_18;
  Context *context_local;
  InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBoundsParamTestInstance>
  *this_local;
  
  local_18 = context;
  context_local = (Context *)this;
  this_00 = (TestInstance *)operator_new(0x2d0);
  context_00 = local_18;
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::map(&local_48,&this->m_shaderPaths);
  DynamicState::anon_unknown_0::DepthBoundsParamTestInstance::DepthBoundsParamTestInstance
            ((DepthBoundsParamTestInstance *)this_00,context_00,&local_48);
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~map(&local_48);
  return this_00;
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}